

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<float,_2,_2> __thiscall
tcu::operator*(tcu *this,Matrix<float,_2,_1> *a,Matrix<float,_1,_2> *b)

{
  float fVar1;
  undefined1 auVar2 [16];
  int row;
  long lVar3;
  long lVar4;
  ulong in_XMM1_Qa;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    fVar1 = (a->m_data).m_data[0].m_data[lVar3];
    in_XMM1_Qa = (ulong)(uint)fVar1;
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      *(float *)(this + lVar4 * 8) = (b->m_data).m_data[lVar4].m_data[0] * fVar1 + 0.0;
    }
    this = this + 4;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_XMM1_Qa;
  return (Vector<tcu::Vector<float,_2>,_2>)(auVar2 << 0x40);
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}